

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircleWidget.cpp
# Opt level: O2

void __thiscall CircleWidget::paintEvent(CircleWidget *this,QPaintEvent *event)

{
  QPainter painter;
  
  QPen::width();
  QPainter::QPainter(&painter,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)&painter,true);
  QPainter::setPen((QPen *)&painter);
  QPainter::setBrush((QBrush *)&painter);
  QWidget::rect(&this->super_QWidget);
  QPainter::drawEllipse((QRect *)&painter);
  QPainter::~QPainter(&painter);
  return;
}

Assistant:

void CircleWidget::paintEvent(QPaintEvent *event) {
    int margin = width() / 6;

    // pen.width() / 2 because when painting a shape with an outline, we have to factor in the width of the pen
    int offset = pen.width() / 2 + margin;

    if (offset >= width() / 2)
        offset -= margin;

    QPainter painter(this);
    painter.setRenderHint(QPainter::Antialiasing);
    painter.setPen(pen);
    painter.setBrush(brush);
    painter.drawEllipse(rect().adjusted(offset, offset, -offset, -offset));
}